

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

RemoteProducer * __thiscall
perfetto::ProducerIPCService::GetProducerForCurrentRequest(ProducerIPCService *this)

{
  ulong uVar1;
  ScopedFile *pSVar2;
  uint uVar3;
  undefined8 uVar4;
  int iVar5;
  _Head_base<0UL,_perfetto::ProducerIPCService::RemoteProducer_*,_false> this_00;
  char *pcVar6;
  char *pcVar7;
  RemoteProducer *extraout_RAX;
  RemoteProducer *extraout_RAX_00;
  undefined4 extraout_var;
  RemoteProducer *pRVar8;
  undefined4 extraout_var_00;
  undefined8 extraout_RAX_01;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  char *pcVar11;
  DeferredBase *this_01;
  ProducerEndpoint *pPVar12;
  long in_RSI;
  _Rb_tree_header *p_Var13;
  ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
  SStack_7c;
  undefined1 auStack_78 [20];
  ScopedFile SStack_64;
  ProducerEndpoint *pPStack_60;
  _Head_base<0UL,_perfetto::ProducerIPCService::RemoteProducer_*,_false> _Stack_58;
  undefined1 auStack_50 [16];
  ulong uStack_40;
  
  uVar1 = (this->super_ProducerPort).super_Service.client_info_.client_id_;
  if (uVar1 != 0) {
    p_Var10 = (this->producers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var10 != (_Base_ptr)0x0) {
      p_Var13 = &(this->producers_)._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = &p_Var13->_M_header;
      do {
        if (*(ulong *)(p_Var10 + 1) >= uVar1) {
          p_Var9 = p_Var10;
        }
        p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < uVar1];
      } while (p_Var10 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var9 != p_Var13) && (*(ulong *)(p_Var9 + 1) <= uVar1)) {
        return (RemoteProducer *)p_Var9[1]._M_parent;
      }
    }
    return (RemoteProducer *)0x0;
  }
  GetProducerForCurrentRequest();
  uStack_40 = (this->super_ProducerPort).super_Service.client_info_.client_id_;
  if (uStack_40 == 0) {
    InitializeConnection();
    base::
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::~ScopedResource(&SStack_7c);
    if (_Stack_58._M_head_impl != (RemoteProducer *)0x0) {
      (*((_Stack_58._M_head_impl)->super_Producer)._vptr_Producer[1])();
    }
    _Unwind_Resume(extraout_RAX_01);
  }
  p_Var10 = (this->producers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var10 != (_Base_ptr)0x0) {
    p_Var13 = &(this->producers_)._M_t._M_impl.super__Rb_tree_header;
    p_Var9 = &p_Var13->_M_header;
    do {
      if (*(ulong *)(p_Var10 + 1) >= uStack_40) {
        p_Var9 = p_Var10;
      }
      p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < uStack_40];
    } while (p_Var10 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var9 != p_Var13) && (*(ulong *)(p_Var9 + 1) <= uStack_40)) {
      ipc::DeferredBase::Reject(this_01);
      return extraout_RAX;
    }
  }
  this_00._M_head_impl = (RemoteProducer *)operator_new(0x38);
  RemoteProducer::RemoteProducer(this_00._M_head_impl);
  uVar3 = (uint)(*(int *)(in_RSI + 0x30) == 2) * 2;
  if (*(int *)(in_RSI + 0x30) == 1) {
    uVar3 = 1;
  }
  _Stack_58._M_head_impl = this_00._M_head_impl;
  if (*(char *)(in_RSI + 0x34) == '\0') {
    pPVar12 = (ProducerEndpoint *)0x0;
    goto LAB_002db494;
  }
  pSVar2 = (this->super_ProducerPort).super_Service.received_fd_;
  if (pSVar2 == (ScopedFile *)0x0) {
    SStack_7c.t_ = -1;
LAB_002db483:
    pPVar12 = (ProducerEndpoint *)0x0;
  }
  else {
    iVar5 = pSVar2->t_;
    pSVar2->t_ = -1;
    SStack_7c.t_ = iVar5;
    if (iVar5 == -1) goto LAB_002db483;
    SStack_7c.t_ = -1;
    SStack_64.t_ = iVar5;
    PosixSharedMemory::AttachToFd((PosixSharedMemory *)auStack_78,&SStack_64,true);
    pPVar12 = (ProducerEndpoint *)auStack_78._0_8_;
    auStack_78._0_8_ = (ProducerEndpoint *)0x0;
    base::
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::reset(&SStack_64,-1);
    if (pPVar12 == (ProducerEndpoint *)0x0) {
      pcVar6 = "/";
      do {
        pcVar11 = pcVar6 + 2;
        pcVar6 = pcVar6 + 1;
      } while (*pcVar11 != '\0');
      pcVar11 = "";
      do {
        pcVar7 = pcVar11 + 1;
        pcVar11 = pcVar11 + 1;
      } while (*pcVar7 != '\0');
      do {
        pcVar7 = pcVar6;
        if (pcVar7 + 1 <
            "workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
           ) break;
        pcVar6 = pcVar7 + -1;
      } while ((pcVar11 <= pcVar7) || (*pcVar7 != '/'));
      pPVar12 = (ProducerEndpoint *)0x0;
      base::LogMessage(kLogError,pcVar7 + 1,0x12160,
                       "Couldn\'t map producer-provided SMB, falling back to service-provided SMB");
    }
  }
  base::
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::reset(&SStack_7c,-1);
LAB_002db494:
  pPStack_60 = pPVar12;
  (*this->core_service_->_vptr_TracingService[2])
            (auStack_78,this->core_service_,this_00._M_head_impl,
             (ulong)(this->super_ProducerPort).super_Service.client_info_.uid_,
             (ulong)(uint)(this->super_ProducerPort).super_Service.client_info_.pid_,in_RSI + 0x10,
             (ulong)*(uint *)(in_RSI + 0xc),0,(ulong)uVar3,(ulong)*(uint *)(in_RSI + 8),&pPStack_60,
             in_RSI + 0x38);
  uVar4 = auStack_78._0_8_;
  auStack_78._0_8_ = (_func_int **)0x0;
  pPVar12 = ((this_00._M_head_impl)->service_endpoint)._M_t.
            super___uniq_ptr_impl<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_>
            ._M_t.
            super__Tuple_impl<0UL,_perfetto::ProducerEndpoint_*,_std::default_delete<perfetto::ProducerEndpoint>_>
            .super__Head_base<0UL,_perfetto::ProducerEndpoint_*,_false>._M_head_impl;
  ((this_00._M_head_impl)->service_endpoint)._M_t.
  super___uniq_ptr_impl<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::ProducerEndpoint_*,_std::default_delete<perfetto::ProducerEndpoint>_>
  .super__Head_base<0UL,_perfetto::ProducerEndpoint_*,_false>._M_head_impl =
       (ProducerEndpoint *)uVar4;
  if ((pPVar12 != (ProducerEndpoint *)0x0) &&
     ((*pPVar12->_vptr_ProducerEndpoint[1])(), (_func_int **)auStack_78._0_8_ != (_func_int **)0x0))
  {
    (**(code **)(*(_func_int **)auStack_78._0_8_ + 8))();
  }
  auStack_78._0_8_ = (_func_int **)0x0;
  if (pPStack_60 != (ProducerEndpoint *)0x0) {
    (*pPStack_60->_vptr_ProducerEndpoint[1])();
  }
  pPStack_60 = (ProducerEndpoint *)0x0;
  pPVar12 = ((this_00._M_head_impl)->service_endpoint)._M_t.
            super___uniq_ptr_impl<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_>
            ._M_t.
            super__Tuple_impl<0UL,_perfetto::ProducerEndpoint_*,_std::default_delete<perfetto::ProducerEndpoint>_>
            .super__Head_base<0UL,_perfetto::ProducerEndpoint_*,_false>._M_head_impl;
  if (pPVar12 == (ProducerEndpoint *)0x0) {
    ipc::DeferredBase::Reject(this_01);
  }
  else {
    iVar5 = (*pPVar12->_vptr_ProducerEndpoint[0xc])();
    ::std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,std::default_delete<perfetto::ProducerIPCService::RemoteProducer>>>,std::_Select1st<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,std::default_delete<perfetto::ProducerIPCService::RemoteProducer>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,std::default_delete<perfetto::ProducerIPCService::RemoteProducer>>>>>
    ::
    _M_emplace_unique<unsigned_long_const&,std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,std::default_delete<perfetto::ProducerIPCService::RemoteProducer>>>
              ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,std::default_delete<perfetto::ProducerIPCService::RemoteProducer>>>,std::_Select1st<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,std::default_delete<perfetto::ProducerIPCService::RemoteProducer>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,std::default_delete<perfetto::ProducerIPCService::RemoteProducer>>>>>
                *)&this->producers_,&uStack_40,
               (unique_ptr<perfetto::ProducerIPCService::RemoteProducer,_std::default_delete<perfetto::ProducerIPCService::RemoteProducer>_>
                *)&_Stack_58);
    ipc::AsyncResult<perfetto::protos::gen::InitializeConnectionResponse>::Create();
    *(char *)(auStack_78._0_8_ + 8) = (char)iVar5;
    *(undefined1 *)(auStack_78._0_8_ + 9) = 1;
    *(byte *)(auStack_78._0_8_ + 0x30) = *(byte *)(auStack_78._0_8_ + 0x30) | 6;
    auStack_50._0_8_ = auStack_78._0_8_;
    auStack_78._0_8_ = (_func_int **)0x0;
    auStack_50._8_8_ = auStack_78._8_8_;
    ipc::Deferred<perfetto::protos::gen::InitializeConnectionResponse>::Resolve
              ((Deferred<perfetto::protos::gen::InitializeConnectionResponse> *)this_01,
               (AsyncResult<perfetto::protos::gen::InitializeConnectionResponse> *)auStack_50);
    pRVar8 = extraout_RAX_00;
    if ((_Head_base<0UL,_perfetto::protos::gen::InitializeConnectionResponse_*,_false>)
        auStack_50._0_8_ !=
        (_Head_base<0UL,_perfetto::protos::gen::InitializeConnectionResponse_*,_false>)0x0) {
      iVar5 = (*((CppMessageObj *)auStack_50._0_8_)->_vptr_CppMessageObj[1])();
      pRVar8 = (RemoteProducer *)CONCAT44(extraout_var,iVar5);
    }
    auStack_50._0_8_ =
         (_Tuple_impl<0UL,_perfetto::protos::gen::InitializeConnectionResponse_*,_std::default_delete<perfetto::protos::gen::InitializeConnectionResponse>_>
          )0x0;
    if ((_func_int **)auStack_78._0_8_ != (_func_int **)0x0) {
      pRVar8 = (RemoteProducer *)(**(code **)(*(_func_int **)auStack_78._0_8_ + 8))();
    }
    this_00._M_head_impl = _Stack_58._M_head_impl;
    if (_Stack_58._M_head_impl == (RemoteProducer *)0x0) {
      return pRVar8;
    }
  }
  iVar5 = (*((this_00._M_head_impl)->super_Producer)._vptr_Producer[1])(this_00._M_head_impl);
  return (RemoteProducer *)CONCAT44(extraout_var_00,iVar5);
}

Assistant:

ProducerIPCService::RemoteProducer*
ProducerIPCService::GetProducerForCurrentRequest() {
  const ipc::ClientID ipc_client_id = ipc::Service::client_info().client_id();
  PERFETTO_CHECK(ipc_client_id);
  auto it = producers_.find(ipc_client_id);
  if (it == producers_.end())
    return nullptr;
  return it->second.get();
}